

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O2

char xSAT_SolverSearch(xSAT_Solver_t *s)

{
  iword *piVar1;
  xSAT_Clause_t *pCla;
  xSAT_Watcher_t *pxVar2;
  xSAT_BQueue_t *pxVar3;
  int *piVar4;
  xSAT_Heap_t *h;
  bool bVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  xSAT_WatchList_t *pxVar13;
  int i;
  ulong uVar14;
  Vec_Int_t *pVVar15;
  Vec_Int_t *pVVar16;
  long lVar17;
  ulong uVar18;
  uint *puVar19;
  int iVar20;
  uint *puVar21;
  long lVar22;
  int iVar23;
  xSAT_Watcher_t *pxVar24;
  uint local_4c;
  
  (s->Stats).nStarts = (s->Stats).nStarts + 1;
  do {
    while (uVar8 = xSAT_SolverPropagate(s), uVar8 == 0xffffffff) {
      pxVar3 = s->bqLBD;
      if ((pxVar3->nCap == pxVar3->nSize) &&
         ((double)(s->nSumLBD / (float)(s->Stats).nConflicts) <
          (double)(pxVar3->nSum / (ulong)(long)pxVar3->nCap & 0xffffffff) * (s->Config).K)) {
        pxVar3->nSize = 0;
        pxVar3->iFirst = 0;
        pxVar3->iEmpty = 0;
        pxVar3->nSum = 0;
        xSAT_SolverCancelUntil(s,0);
        return '\0';
      }
      if (s->vTrailLim->nSize == 0) {
        xSAT_SolverSimplify(s);
      }
      lVar17 = (s->Stats).nConflicts;
      if (s->nConfBeforeReduce <= lVar17) {
        s->nRC1 = lVar17 / (long)s->nRC2 + 1;
        xSAT_SolverReduceDB(s);
        iVar10 = s->nRC2 + (s->Config).nIncReduce;
        s->nRC2 = iVar10;
        s->nConfBeforeReduce = iVar10 * (int)s->nRC1;
      }
      iVar10 = -1;
      while ((iVar10 == -1 || (cVar6 = Vec_StrEntry(s->vAssigns,iVar10), cVar6 != '\x03'))) {
        h = s->hOrder;
        if (h->vHeap->nSize == 0) {
          return '\x01';
        }
        iVar10 = Vec_IntEntry(h->vHeap,0);
        pVVar15 = h->vHeap;
        if ((long)pVVar15->nSize < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        Vec_IntWriteEntry(pVVar15,0,pVVar15->pArray[(long)pVVar15->nSize + -1]);
        pVVar15 = h->vIndices;
        iVar23 = Vec_IntEntry(h->vHeap,0);
        Vec_IntWriteEntry(pVVar15,iVar23,0);
        Vec_IntWriteEntry(h->vIndices,iVar10,-1);
        Vec_IntPop(h->vHeap);
        if (1 < h->vHeap->nSize) {
          xSAT_HeapPercolateDown(h,0);
        }
      }
      cVar6 = Vec_StrEntry(s->vPolarity,iVar10);
      cVar7 = Vec_StrEntry(s->vAssigns,iVar10);
      if (cVar7 != '\x03') {
        __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == VarX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                      ,0x166,"void xSAT_SolverNewDecision(xSAT_Solver_t *, int)");
      }
      piVar1 = &(s->Stats).nDecisions;
      *piVar1 = *piVar1 + 1;
      Vec_IntPush(s->vTrailLim,s->vTrail->nSize);
      xSAT_SolverEnqueue(s,(uint)(cVar6 != '\0') + iVar10 * 2,0xffffffff);
    }
    piVar1 = &(s->Stats).nConflicts;
    *piVar1 = *piVar1 + 1;
    if (s->vTrailLim->nSize == 0) {
      return -1;
    }
    xSAT_BQueuePush(s->bqTrail,s->vTrail->nSize);
    if ((((long)(s->Config).nFirstBlockRestart < (s->Stats).nConflicts) &&
        (pxVar3 = s->bqLBD, pxVar3->nCap == pxVar3->nSize)) &&
       ((double)(s->bqTrail->nSum / (ulong)(long)s->bqTrail->nSize & 0xffffffff) * (s->Config).R <
        (double)s->vTrail->nSize)) {
      pxVar3->nSize = 0;
      pxVar3->iFirst = 0;
      pxVar3->iEmpty = 0;
      pxVar3->nSum = 0;
    }
    pVVar15 = s->vLearntClause;
    pVVar15->nSize = 0;
    piVar4 = s->vTrail->pArray;
    iVar23 = s->vTrail->nSize + -1;
    local_4c = 0xfffffffe;
    Vec_IntPush(pVVar15,-2);
    iVar10 = 0;
    do {
      if (uVar8 == 0xffffffff) {
        __assert_fail("ConfCRef != CRefUndef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                      ,0x22d,
                      "void xSAT_SolverAnalyze(xSAT_Solver_t *, unsigned int, Vec_Int_t *, int *, unsigned int *)"
                     );
      }
      pCla = (xSAT_Clause_t *)(s->pMemory->pData + (int)uVar8);
      if (((local_4c != 0xfffffffe) && (pCla->nSize == 2)) &&
         (cVar6 = Vec_StrEntry(s->vAssigns,*(int *)(pCla + 1) >> 1),
         (*(uint *)(pCla + 1) & 1 ^ (int)cVar6) == 1)) {
        cVar6 = Vec_StrEntry(s->vAssigns,pCla[1].nSize >> 1);
        if ((pCla[1].nSize & 1U) != (int)cVar6) {
          __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[1] ) ) == xSAT_LitSign( ( Lits[1] ) )"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                        ,0x233,
                        "void xSAT_SolverAnalyze(xSAT_Solver_t *, unsigned int, Vec_Int_t *, int *, unsigned int *)"
                       );
        }
        iVar20 = *(int *)(pCla + 1);
        *(int *)(pCla + 1) = pCla[1].nSize;
        pCla[1].nSize = iVar20;
      }
      if ((((ulong)*pCla & 1) != 0) &&
         (xSAT_SolverClaActBump(s,pCla), 0x2f < *(uint *)pCla && (*(uint *)pCla & 1) != 0)) {
        s->nStamp = s->nStamp + 1;
        iVar20 = 0;
        for (lVar17 = 0; lVar17 < pCla->nSize; lVar17 = lVar17 + 1) {
          iVar9 = Vec_IntEntry(s->vLevels,*(int *)(&pCla[1].field_0x0 + lVar17 * 4) >> 1);
          uVar8 = Vec_IntEntry(s->vStamp,iVar9);
          if (uVar8 != s->nStamp) {
            Vec_IntWriteEntry(s->vStamp,iVar9,s->nStamp);
            iVar20 = iVar20 + 1;
          }
        }
        uVar8 = *(uint *)pCla;
        if (iVar20 + 1U < uVar8 >> 4) {
          uVar11 = uVar8 & 7;
          if ((s->Config).nLBDFrozenClause < uVar8 >> 4) {
            uVar11 = uVar8;
          }
          *(uint *)pCla = uVar11 & 0xf | iVar20 << 4;
        }
      }
      for (uVar14 = (ulong)(local_4c != 0xfffffffe); (long)uVar14 < (long)pCla->nSize;
          uVar14 = uVar14 + 1) {
        iVar20 = *(int *)(&pCla[1].field_0x0 + uVar14 * 4) >> 1;
        cVar6 = Vec_StrEntry(s->vSeen,iVar20);
        if ((cVar6 == '\0') && (iVar9 = Vec_IntEntry(s->vLevels,iVar20), 0 < iVar9)) {
          Vec_StrWriteEntry(s->vSeen,iVar20,'\x01');
          xSAT_SolverVarActBump(s,iVar20);
          iVar9 = Vec_IntEntry(s->vLevels,iVar20);
          if (iVar9 < s->vTrailLim->nSize) {
            iVar20 = *(int *)(&pCla[1].field_0x0 + uVar14 * 4);
            pVVar16 = pVVar15;
          }
          else {
            iVar10 = iVar10 + 1;
            iVar9 = Vec_IntEntry(s->vReasons,iVar20);
            if ((iVar9 == -1) ||
               (iVar9 = Vec_IntEntry(s->vReasons,iVar20), (s->pMemory->pData[iVar9] & 1) == 0))
            goto LAB_00729d4b;
            pVVar16 = s->vLastDLevel;
          }
          Vec_IntPush(pVVar16,iVar20);
        }
LAB_00729d4b:
      }
      puVar21 = (uint *)(piVar4 + (long)iVar23 + 1);
      do {
        puVar19 = puVar21 + -1;
        puVar21 = puVar21 + -1;
        cVar6 = Vec_StrEntry(s->vSeen,(int)*puVar19 >> 1);
        iVar23 = iVar23 + -1;
      } while (cVar6 == '\0');
      local_4c = *puVar21;
      uVar8 = Vec_IntEntry(s->vReasons,(int)local_4c >> 1);
      Vec_StrWriteEntry(s->vSeen,(int)local_4c >> 1,'\0');
      bVar5 = 1 < iVar10;
      iVar10 = iVar10 + -1;
    } while (bVar5);
    puVar21 = (uint *)pVVar15->pArray;
    *puVar21 = local_4c ^ 1;
    uVar8 = 0;
    for (lVar17 = 1; uVar14 = (ulong)pVVar15->nSize, lVar17 < (long)uVar14; lVar17 = lVar17 + 1) {
      uVar11 = Vec_IntEntry(s->vLevels,(int)puVar21[lVar17] >> 1);
      uVar8 = uVar8 | 1 << (uVar11 & 0x1f);
    }
    pVVar16 = s->vTagged;
    for (iVar10 = 0; iVar10 < (int)uVar14; iVar10 = iVar10 + 1) {
      iVar23 = Vec_IntEntry(pVVar15,iVar10);
      Vec_IntPush(pVVar16,iVar23);
      uVar14 = (ulong)(uint)pVVar15->nSize;
    }
    lVar17 = 1;
    iVar10 = 1;
LAB_00729ec9:
    if (lVar17 < (int)uVar14) {
      iVar23 = Vec_IntEntry(s->vReasons,(int)puVar21[lVar17] >> 1);
      if (iVar23 == -1) goto LAB_0072a09d;
      uVar11 = puVar21[lVar17];
      iVar23 = s->vTagged->nSize;
      iVar20 = Vec_IntEntry(s->vReasons,(int)uVar11 >> 1);
      if (iVar20 == -1) {
        __assert_fail("( unsigned ) Vec_IntEntry( s->vReasons, xSAT_Lit2Var( Lit ) ) != CRefUndef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                      ,0x19e,"int xSAT_SolverIsLitRemovable(xSAT_Solver_t *, int, int)");
      }
      pVVar16 = s->vStack;
      pVVar16->nSize = 0;
      Vec_IntPush(pVVar16,(int)uVar11 >> 1);
      while (s->vStack->nSize != 0) {
        iVar20 = Vec_IntPop(s->vStack);
        iVar9 = Vec_IntEntry(s->vReasons,iVar20);
        if (iVar9 == -1) {
          puVar19 = (uint *)0x0;
        }
        else {
          puVar19 = s->pMemory->pData + iVar9;
        }
        iVar20 = Vec_IntEntry(s->vReasons,iVar20);
        if (iVar20 == -1) {
          __assert_fail("(unsigned) Vec_IntEntry( s->vReasons, v ) != CRefUndef",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                        ,0x1a9,"int xSAT_SolverIsLitRemovable(xSAT_Solver_t *, int, int)");
        }
        if ((puVar19[1] == 2) &&
           (cVar6 = Vec_StrEntry(s->vAssigns,(int)puVar19[2] >> 1),
           (puVar19[2] & 1 ^ (int)cVar6) == 1)) {
          cVar6 = Vec_StrEntry(s->vAssigns,(int)puVar19[3] >> 1);
          if ((puVar19[3] & 1) != (int)cVar6) {
            __assert_fail("Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[1] ) ) == xSAT_LitSign( ( Lits[1] ) )"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolver.c"
                          ,0x1ac,"int xSAT_SolverIsLitRemovable(xSAT_Solver_t *, int, int)");
          }
          uVar11 = puVar19[2];
          puVar19[2] = puVar19[3];
          puVar19[3] = uVar11;
        }
        for (lVar22 = 1; lVar22 < (int)puVar19[1]; lVar22 = lVar22 + 1) {
          iVar20 = (int)puVar19[lVar22 + 2] >> 1;
          cVar6 = Vec_StrEntry(s->vSeen,iVar20);
          if ((cVar6 == '\0') && (iVar9 = Vec_IntEntry(s->vLevels,iVar20), iVar9 != 0)) {
            iVar12 = Vec_IntEntry(s->vReasons,iVar20);
            iVar9 = iVar23;
            if ((iVar12 == -1) ||
               (uVar11 = Vec_IntEntry(s->vLevels,iVar20), (uVar8 >> (uVar11 & 0x1f) & 1) == 0))
            goto LAB_0072a06c;
            Vec_IntPush(s->vStack,iVar20);
            Vec_IntPush(s->vTagged,puVar19[lVar22 + 2]);
            Vec_StrWriteEntry(s->vSeen,iVar20,'\x01');
          }
        }
      }
      goto LAB_0072a0b4;
    }
    Vec_IntShrink(pVVar15,iVar10);
    if (pVVar15->nSize < 0x1f) {
      iVar10 = xSAT_SolverClaCalcLBD2(s,pVVar15);
      if (iVar10 < 7) {
        pxVar13 = xSAT_VecWatchListEntry(s->vBinWatches,*puVar21 ^ 1);
        pxVar24 = pxVar13->pArray;
        iVar10 = pxVar13->nSize;
        s->nStamp = s->nStamp + 1;
        for (iVar23 = 0; iVar23 < pVVar15->nSize; iVar23 = iVar23 + 1) {
          iVar20 = Vec_IntEntry(pVVar15,iVar23);
          Vec_IntWriteEntry(s->vStamp,iVar20 >> 1,s->nStamp);
        }
        pxVar2 = pxVar24 + iVar10;
        iVar10 = 0;
        for (; pxVar24 < pxVar2; pxVar24 = pxVar24 + 1) {
          uVar8 = pxVar24->Blocker;
          iVar23 = (int)uVar8 >> 1;
          uVar11 = Vec_IntEntry(s->vStamp,iVar23);
          if ((uVar11 == s->nStamp) &&
             (cVar6 = Vec_StrEntry(s->vAssigns,iVar23), (uVar8 & 1) == (int)cVar6)) {
            iVar10 = iVar10 + 1;
            Vec_IntWriteEntry(s->vStamp,iVar23,s->nStamp - 1);
          }
        }
        if (0 < iVar10) {
          iVar20 = pVVar15->nSize;
          iVar23 = iVar20 + -1;
          for (iVar9 = 1; iVar9 < iVar20 - iVar10; iVar9 = iVar9 + 1) {
            uVar8 = Vec_IntEntry(s->vStamp,(int)puVar21[iVar9] >> 1);
            if (uVar8 != s->nStamp) {
              uVar8 = puVar21[iVar23];
              puVar21[iVar23] = puVar21[iVar9];
              puVar21[iVar9] = uVar8;
              iVar9 = iVar9 + -1;
              iVar23 = iVar23 + -1;
            }
            iVar20 = pVVar15->nSize;
          }
          Vec_IntShrink(pVVar15,iVar20 - iVar10);
        }
      }
      iVar10 = 0;
      if (pVVar15->nSize != 1) goto LAB_0072a3e8;
    }
    else {
LAB_0072a3e8:
      piVar4 = pVVar15->pArray;
      iVar10 = Vec_IntEntry(s->vLevels,piVar4[1] >> 1);
      uVar18 = 1;
      for (uVar14 = 2; (long)uVar14 < (long)pVVar15->nSize; uVar14 = uVar14 + 1) {
        iVar23 = Vec_IntEntry(s->vLevels,piVar4[uVar14] >> 1);
        if (iVar10 < iVar23) {
          iVar10 = Vec_IntEntry(s->vLevels,piVar4[uVar14] >> 1);
          uVar18 = uVar14 & 0xffffffff;
        }
      }
      iVar10 = piVar4[1];
      piVar4[1] = piVar4[(int)uVar18];
      piVar4[(int)uVar18] = iVar10;
      iVar10 = Vec_IntEntry(s->vLevels,piVar4[1] >> 1);
    }
    uVar8 = xSAT_SolverClaCalcLBD2(s,pVVar15);
    pVVar15 = s->vLastDLevel;
    iVar23 = pVVar15->nSize;
    if (0 < iVar23) {
      for (iVar20 = 0; iVar20 < iVar23; iVar20 = iVar20 + 1) {
        iVar23 = Vec_IntEntry(pVVar15,iVar20);
        iVar9 = Vec_IntEntry(s->vReasons,iVar23);
        if (s->pMemory->pData[iVar9] >> 4 < uVar8) {
          xSAT_SolverVarActBump(s,iVar23);
        }
        pVVar15 = s->vLastDLevel;
        iVar23 = pVVar15->nSize;
      }
      pVVar15->nSize = 0;
    }
    for (iVar23 = 0; pVVar15 = s->vTagged, iVar23 < pVVar15->nSize; iVar23 = iVar23 + 1) {
      iVar20 = Vec_IntEntry(pVVar15,iVar23);
      Vec_StrWriteEntry(s->vSeen,iVar20 >> 1,'\0');
    }
    pVVar15->nSize = 0;
    s->nSumLBD = (float)uVar8 + s->nSumLBD;
    xSAT_BQueuePush(s->bqLBD,uVar8);
    xSAT_SolverCancelUntil(s,iVar10);
    pVVar15 = s->vLearntClause;
    if (pVVar15->nSize == 1) {
      uVar8 = 0xffffffff;
    }
    else {
      uVar8 = xSAT_SolverClaNew(s,pVVar15,1);
      pVVar15 = s->vLearntClause;
    }
    iVar10 = Vec_IntEntry(pVVar15,0);
    xSAT_SolverEnqueue(s,iVar10,uVar8);
    s->nVarActInc = (s->nVarActInc >> 4) + s->nVarActInc;
    s->nClaActInc = (s->nClaActInc >> 10) + s->nClaActInc;
  } while( true );
LAB_0072a06c:
  for (; pVVar16 = s->vTagged, iVar9 < pVVar16->nSize; iVar9 = iVar9 + 1) {
    iVar20 = Vec_IntEntry(pVVar16,iVar9);
    Vec_StrWriteEntry(s->vSeen,iVar20 >> 1,'\0');
  }
  Vec_IntShrink(pVVar16,iVar23);
LAB_0072a09d:
  lVar22 = (long)iVar10;
  iVar10 = iVar10 + 1;
  puVar21[lVar22] = puVar21[lVar17];
LAB_0072a0b4:
  lVar17 = lVar17 + 1;
  uVar14 = (ulong)(uint)pVVar15->nSize;
  goto LAB_00729ec9;
}

Assistant:

char xSAT_SolverSearch( xSAT_Solver_t * s )
{
    iword conflictC  = 0;

    s->Stats.nStarts++;
    for (;;)
    {
        unsigned hConfl = xSAT_SolverPropagate( s );

        if ( hConfl != CRefUndef )
        {
            /* Conflict */
            int BacktrackLevel;
            unsigned nLBD;
            unsigned CRef;

            s->Stats.nConflicts++;
            conflictC++;

            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                return LBoolFalse;

            xSAT_BQueuePush( s->bqTrail, Vec_IntSize( s->vTrail ) );
            if ( s->Stats.nConflicts > s->Config.nFirstBlockRestart && xSAT_BQueueIsValid( s->bqLBD ) && ( Vec_IntSize( s->vTrail ) > ( s->Config.R * ( iword ) xSAT_BQueueAvg( s->bqTrail ) ) ) )
                xSAT_BQueueClean(s->bqLBD);

            Vec_IntClear( s->vLearntClause );
            xSAT_SolverAnalyze( s, hConfl, s->vLearntClause, &BacktrackLevel, &nLBD );

            s->nSumLBD += nLBD;
            xSAT_BQueuePush( s->bqLBD, nLBD );
            xSAT_SolverCancelUntil( s, BacktrackLevel );

            CRef = Vec_IntSize( s->vLearntClause ) == 1 ? CRefUndef : xSAT_SolverClaNew( s, s->vLearntClause , 1 );
            xSAT_SolverEnqueue( s, Vec_IntEntry( s->vLearntClause , 0 ), CRef );

            xSAT_SolverVarActDecay( s );
            xSAT_SolverClaActDecay( s );
        }
        else
        {
            /* No conflict */
            int NextVar;
            if ( xSAT_BQueueIsValid( s->bqLBD ) && ( ( ( iword )xSAT_BQueueAvg( s->bqLBD ) * s->Config.K ) > ( s->nSumLBD / s->Stats.nConflicts ) ) )
            {
                xSAT_BQueueClean( s->bqLBD );
                xSAT_SolverCancelUntil( s, 0 );
                return LBoolUndef;
            }

            // Simplify the set of problem clauses:
            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                xSAT_SolverSimplify( s );

            // Reduce the set of learnt clauses:
            if ( s->Stats.nConflicts >= s->nConfBeforeReduce )
            {
                s->nRC1 = ( s->Stats.nConflicts / s->nRC2 ) + 1;
                xSAT_SolverReduceDB(s);
                s->nRC2 += s->Config.nIncReduce;
                s->nConfBeforeReduce = s->nRC1 * s->nRC2;
            }

            // New variable decision:
            NextVar = xSAT_SolverDecide( s );

            if ( NextVar == VarUndef )
                return LBoolTrue;

            xSAT_SolverNewDecision( s, xSAT_Var2Lit( NextVar, ( int ) Vec_StrEntry( s->vPolarity, NextVar ) ) );
        }
    }

    return LBoolUndef; // cannot happen
}